

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

X509_EXTENSION * X509V3_EXT_nconf(CONF *conf,X509V3_CTX *ctx,char *name,char *value)

{
  int crit_00;
  int iVar1;
  X509_EXTENSION *ret;
  int ext_type;
  int crit;
  X509V3_CTX ctx_tmp;
  char *value_local;
  char *name_local;
  X509V3_CTX *ctx_local;
  CONF *conf_local;
  
  ctx_tmp.db = (CONF *)value;
  name_local = (char *)ctx;
  if (ctx == (X509V3_CTX *)0x0) {
    X509V3_set_ctx((X509V3_CTX *)&ext_type,(X509 *)0x0,(X509 *)0x0,(X509_REQ *)0x0,(X509_CRL *)0x0,0
                  );
    X509V3_set_nconf((X509V3_CTX *)&ext_type,conf);
    name_local = (char *)&ext_type;
  }
  crit_00 = v3_check_critical((char **)&ctx_tmp.db);
  iVar1 = v3_check_generic((char **)&ctx_tmp.db);
  if (iVar1 == 0) {
    iVar1 = OBJ_sn2nid(name);
    conf_local = (CONF *)do_ext_nconf((CONF *)conf,(X509V3_CTX *)name_local,iVar1,crit_00,
                                      (char *)ctx_tmp.db);
    if ((X509_EXTENSION *)conf_local == (X509_EXTENSION *)0x0) {
      ERR_put_error(0x14,0,0x6e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                    ,0x3c);
      ERR_add_error_data(4,"name=",name,", value=",ctx_tmp.db);
    }
  }
  else {
    conf_local = (CONF *)v3_generic_extension
                                   (name,(char *)ctx_tmp.db,crit_00,iVar1,(X509V3_CTX *)name_local);
  }
  return (X509_EXTENSION *)conf_local;
}

Assistant:

X509_EXTENSION *X509V3_EXT_nconf(const CONF *conf, const X509V3_CTX *ctx,
                                 const char *name, const char *value) {
  // If omitted, fill in an empty |X509V3_CTX|.
  X509V3_CTX ctx_tmp;
  if (ctx == NULL) {
    X509V3_set_ctx(&ctx_tmp, NULL, NULL, NULL, NULL, 0);
    X509V3_set_nconf(&ctx_tmp, conf);
    ctx = &ctx_tmp;
  }

  int crit = v3_check_critical(&value);
  int ext_type = v3_check_generic(&value);
  if (ext_type != 0) {
    return v3_generic_extension(name, value, crit, ext_type, ctx);
  }
  X509_EXTENSION *ret = do_ext_nconf(conf, ctx, OBJ_sn2nid(name), crit, value);
  if (!ret) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_ERROR_IN_EXTENSION);
    ERR_add_error_data(4, "name=", name, ", value=", value);
  }
  return ret;
}